

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

ArrayPtr<capnp::word> __thiscall
capnp::SchemaLoader::Impl::makeUncheckedNodeEnforcingSizeRequirements(Impl *this,Reader node)

{
  size_t amount;
  ushort uVar1;
  ushort uVar2;
  Reader *reader;
  ushort uVar3;
  size_t sVar4;
  word *pwVar5;
  ArrayPtr<capnp::word> AVar6;
  MessageSizeCounts MVar7;
  ArrayPtr<capnp::word> uncheckedBuffer;
  StructReader local_58;
  
  if (((0x6f < node._reader.dataSize) && (*(short *)((long)node._reader.data + 0xc) == 1)) &&
     (kj::
      Table<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>>
      ::find<0ul,unsigned_long&>
                ((Table<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>>
                  *)&local_58,(unsigned_long *)&this->structSizeRequirements),
     local_58.segment != (SegmentReader *)0x0)) {
    if (node._reader.dataSize < 0x80) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)((long)node._reader.data + 0xe);
    }
    uVar1 = (ushort)((local_58.segment)->id).value;
    if (uVar3 < uVar1) {
      uVar2 = *(ushort *)((long)&((local_58.segment)->id).value + 2);
    }
    else {
      if (node._reader.dataSize < 0xd0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ushort *)((long)node._reader.data + 0x18);
      }
      uVar2 = *(ushort *)((long)&((local_58.segment)->id).value + 2);
      if (uVar2 <= uVar3) goto LAB_0013841c;
    }
    AVar6 = rewriteStructNodeWithSizes(this,node,(uint)uVar1,(uint)uVar2);
    return AVar6;
  }
LAB_0013841c:
  local_58._32_8_ = node._reader._32_8_;
  local_58.nestingLimit = node._reader.nestingLimit;
  local_58._44_4_ = node._reader._44_4_;
  local_58.data = node._reader.data;
  local_58.pointers = node._reader.pointers;
  local_58.segment = node._reader.segment;
  local_58.capTable = node._reader.capTable;
  MVar7 = _::StructReader::totalSize(&local_58);
  amount = MVar7.wordCount * 8 + 8;
  pwVar5 = (word *)(MVar7.wordCount + 1);
  sVar4 = 0;
  reader = (Reader *)kj::Arena::allocateBytes(&this->arena,amount,8,false);
  AVar6.size_ = (size_t)pwVar5;
  AVar6.ptr = (word *)reader;
  memset(reader,0,amount);
  uncheckedBuffer.size_ = sVar4;
  uncheckedBuffer.ptr = pwVar5;
  copyToUnchecked<capnp::schema::Node::Reader&>((capnp *)&local_58,reader,uncheckedBuffer);
  return AVar6;
}

Assistant:

kj::ArrayPtr<word> SchemaLoader::Impl::makeUncheckedNodeEnforcingSizeRequirements(
    schema::Node::Reader node) {
  if (node.isStruct()) {
    KJ_IF_SOME(requirement, structSizeRequirements.find(node.getId())) {
      auto structNode = node.getStruct();
      if (structNode.getDataWordCount() < requirement.dataWordCount ||
          structNode.getPointerCount() < requirement.pointerCount) {
        return rewriteStructNodeWithSizes(node, requirement.dataWordCount,
                                          requirement.pointerCount);
      }
    }
  }

  return makeUncheckedNode(node);
}